

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_vertical_4_dual_sse2
               (uint16_t *s,int p,uint8_t *blimit0,uint8_t *limit0,uint8_t *thresh0,uint8_t *blimit1
               ,uint8_t *limit1,uint8_t *thresh1,int bd)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ushort uVar19;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  undefined1 auVar20 [16];
  undefined1 auVar23 [16];
  ushort uVar30;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i d1;
  __m128i d0;
  __m128i d7;
  __m128i d6;
  ushort local_178;
  ushort uStack_176;
  ushort uStack_174;
  ushort uStack_172;
  ushort uStack_170;
  ushort uStack_16e;
  ushort uStack_16c;
  ushort uStack_16a;
  __m128i d3;
  __m128i d2;
  longlong local_e8 [2];
  __m128i thresh0_1;
  __m128i qs [2];
  __m128i ps [2];
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  __m128i d5;
  __m128i d4;
  short sVar9;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  short sVar18;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  short sVar31;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  uVar1 = *(ulong *)(s + -2);
  uVar2 = *(undefined8 *)(s + (long)p + -2);
  auVar38._8_4_ = 0;
  auVar38._0_8_ = uVar1;
  auVar38._12_2_ = (short)(uVar1 >> 0x30);
  auVar38._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar37._12_4_ = auVar38._12_4_;
  auVar37._8_2_ = 0;
  auVar37._0_8_ = uVar1;
  auVar37._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar36._10_6_ = auVar37._10_6_;
  auVar36._8_2_ = (short)(uVar1 >> 0x20);
  auVar36._0_8_ = uVar1;
  auVar3._4_8_ = auVar36._8_8_;
  auVar3._2_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar3._0_2_ = (short)(uVar1 >> 0x10);
  auVar35._0_4_ = CONCAT22((short)uVar2,(short)uVar1);
  auVar35._4_12_ = auVar3;
  uVar1 = *(ulong *)(s + (long)(p * 2) + -2);
  uVar2 = *(undefined8 *)(s + (long)(p * 3) + -2);
  auVar33._8_4_ = 0;
  auVar33._0_8_ = uVar1;
  auVar33._12_2_ = (short)(uVar1 >> 0x30);
  auVar33._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar23._12_4_ = auVar33._12_4_;
  auVar23._8_2_ = 0;
  auVar23._0_8_ = uVar1;
  auVar23._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar14._10_6_ = auVar23._10_6_;
  auVar14._8_2_ = (short)(uVar1 >> 0x20);
  auVar14._0_8_ = uVar1;
  auVar4._4_8_ = auVar14._8_8_;
  auVar4._2_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar4._0_2_ = (short)(uVar1 >> 0x10);
  d0[0]._6_2_ = (short)uVar2;
  d0[0]._4_2_ = (short)uVar1;
  uVar1 = *(ulong *)(s + (long)(p * 4) + -2);
  uVar2 = *(undefined8 *)(s + (long)(p * 5) + -2);
  auVar12._8_4_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12._12_2_ = (short)(uVar1 >> 0x30);
  auVar12._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar11._12_4_ = auVar12._12_4_;
  auVar11._8_2_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar10._10_6_ = auVar11._10_6_;
  auVar10._8_2_ = (short)(uVar1 >> 0x20);
  auVar10._0_8_ = uVar1;
  auVar5._4_8_ = auVar10._8_8_;
  auVar5._2_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar5._0_2_ = (short)(uVar1 >> 0x10);
  auVar34._0_4_ = CONCAT22((short)uVar2,(short)uVar1);
  auVar34._4_12_ = auVar5;
  uVar1 = *(ulong *)(s + (long)(p * 6) + -2);
  uVar2 = *(undefined8 *)(s + (long)(p * 7) + -2);
  auVar22._8_4_ = 0;
  auVar22._0_8_ = uVar1;
  auVar22._12_2_ = (short)(uVar1 >> 0x30);
  auVar22._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar21._12_4_ = auVar22._12_4_;
  auVar21._8_2_ = 0;
  auVar21._0_8_ = uVar1;
  auVar21._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar20._10_6_ = auVar21._10_6_;
  auVar20._8_2_ = (short)(uVar1 >> 0x20);
  auVar20._0_8_ = uVar1;
  auVar6._4_8_ = auVar20._8_8_;
  auVar6._2_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar6._0_2_ = (short)(uVar1 >> 0x10);
  d0[1]._6_2_ = (short)uVar2;
  d0[1]._4_2_ = (short)uVar1;
  auVar40._0_8_ = auVar35._0_8_;
  auVar40._8_4_ = auVar3._0_4_;
  auVar40._12_4_ = auVar4._0_4_;
  d0[0]._0_4_ = auVar35._0_4_;
  auVar32._0_8_ = auVar34._0_8_;
  auVar32._8_4_ = auVar5._0_4_;
  auVar32._12_4_ = auVar6._0_4_;
  d0[1]._0_4_ = auVar34._0_4_;
  d1[1] = auVar32._8_8_;
  d1[0] = auVar40._8_8_;
  auVar39._0_8_ = CONCAT44(auVar14._8_4_,auVar36._8_4_);
  auVar39._8_4_ = auVar37._12_4_;
  auVar39._12_4_ = auVar23._12_4_;
  auVar13._0_8_ = CONCAT44(auVar20._8_4_,auVar10._8_4_);
  auVar13._8_4_ = auVar11._12_4_;
  auVar13._12_4_ = auVar21._12_4_;
  d2[1] = auVar13._0_8_;
  d2[0] = auVar39._0_8_;
  d3[1] = auVar13._8_8_;
  d3[0] = auVar39._8_8_;
  auVar7 = psubusw((undefined1  [16])d2,(undefined1  [16])d1);
  auVar33 = psubusw((undefined1  [16])d1,(undefined1  [16])d2);
  auVar8 = psubusw((undefined1  [16])d3,(undefined1  [16])d0);
  auVar34 = psubusw((undefined1  [16])d0,(undefined1  [16])d3);
  auVar34 = auVar34 | auVar8;
  auVar8 = psubusw((undefined1  [16])d0,(undefined1  [16])d1);
  auVar14 = psubusw((undefined1  [16])d1,(undefined1  [16])d0);
  auVar14 = auVar14 | auVar8;
  auVar8 = psubusw((undefined1  [16])d3,(undefined1  [16])d2);
  auVar23 = psubusw((undefined1  [16])d2,(undefined1  [16])d3);
  auVar23 = auVar23 | auVar8;
  sVar9 = auVar14._0_2_;
  sVar18 = auVar23._0_2_;
  uVar19 = (ushort)(sVar18 < sVar9) * sVar9 | (ushort)(sVar18 >= sVar9) * sVar18;
  sVar9 = auVar14._2_2_;
  sVar18 = auVar23._2_2_;
  uVar24 = (ushort)(sVar18 < sVar9) * sVar9 | (ushort)(sVar18 >= sVar9) * sVar18;
  sVar9 = auVar14._4_2_;
  sVar18 = auVar23._4_2_;
  uVar25 = (ushort)(sVar18 < sVar9) * sVar9 | (ushort)(sVar18 >= sVar9) * sVar18;
  sVar9 = auVar14._6_2_;
  sVar18 = auVar23._6_2_;
  uVar26 = (ushort)(sVar18 < sVar9) * sVar9 | (ushort)(sVar18 >= sVar9) * sVar18;
  sVar9 = auVar14._8_2_;
  sVar18 = auVar23._8_2_;
  uVar27 = (ushort)(sVar18 < sVar9) * sVar9 | (ushort)(sVar18 >= sVar9) * sVar18;
  sVar9 = auVar14._10_2_;
  sVar18 = auVar23._10_2_;
  uVar28 = (ushort)(sVar18 < sVar9) * sVar9 | (ushort)(sVar18 >= sVar9) * sVar18;
  sVar9 = auVar14._12_2_;
  sVar18 = auVar23._12_2_;
  sVar31 = auVar23._14_2_;
  uVar29 = (ushort)(sVar18 < sVar9) * sVar9 | (ushort)(sVar18 >= sVar9) * sVar18;
  sVar9 = auVar14._14_2_;
  uVar30 = (ushort)(sVar31 < sVar9) * sVar9 | (ushort)(sVar31 >= sVar9) * sVar31;
  get_limit_dual(blimit0,limit0,thresh0,blimit1,limit1,thresh1,bd,&d6,&d7,&thresh0_1,&local_e8);
  auVar7 = paddusw(auVar33 | auVar7,auVar33 | auVar7);
  local_178 = auVar34._0_2_;
  uStack_176 = auVar34._2_2_;
  uStack_174 = auVar34._4_2_;
  uStack_172 = auVar34._6_2_;
  uStack_170 = auVar34._8_2_;
  uStack_16e = auVar34._10_2_;
  uStack_16c = auVar34._12_2_;
  uStack_16a = auVar34._14_2_;
  auVar15._0_2_ = local_178 >> 1;
  auVar15._2_2_ = uStack_176 >> 1;
  auVar15._4_2_ = uStack_174 >> 1;
  auVar15._6_2_ = uStack_172 >> 1;
  auVar15._8_2_ = uStack_170 >> 1;
  auVar15._10_2_ = uStack_16e >> 1;
  auVar15._12_2_ = uStack_16c >> 1;
  auVar15._14_2_ = uStack_16a >> 1;
  auVar7 = paddusw(auVar15,auVar7);
  auVar7 = auVar7 ^ _DAT_00433870;
  auVar8._8_8_ = d6[1];
  auVar8._0_8_ = d6[0];
  auVar8 = _DAT_00433870 ^ auVar8;
  auVar16._0_2_ = -(ushort)(auVar8._0_2_ < auVar7._0_2_);
  auVar16._2_2_ = -(ushort)(auVar8._2_2_ < auVar7._2_2_);
  auVar16._4_2_ = -(ushort)(auVar8._4_2_ < auVar7._4_2_);
  auVar16._6_2_ = -(ushort)(auVar8._6_2_ < auVar7._6_2_);
  auVar16._8_2_ = -(ushort)(auVar8._8_2_ < auVar7._8_2_);
  auVar16._10_2_ = -(ushort)(auVar8._10_2_ < auVar7._10_2_);
  auVar16._12_2_ = -(ushort)(auVar8._12_2_ < auVar7._12_2_);
  auVar16._14_2_ = -(ushort)(auVar8._14_2_ < auVar7._14_2_);
  auVar7._8_8_ = d7[1];
  auVar7._0_8_ = d7[0];
  auVar8 = paddusw(_DAT_0046d7b0,auVar7);
  auVar8 = auVar8 & auVar16;
  sVar9 = auVar8._0_2_;
  auVar17._0_2_ = (sVar9 < (short)uVar19) * uVar19 | (ushort)(sVar9 >= (short)uVar19) * sVar9;
  sVar9 = auVar8._2_2_;
  auVar17._2_2_ = (sVar9 < (short)uVar24) * uVar24 | (ushort)(sVar9 >= (short)uVar24) * sVar9;
  sVar9 = auVar8._4_2_;
  auVar17._4_2_ = (sVar9 < (short)uVar25) * uVar25 | (ushort)(sVar9 >= (short)uVar25) * sVar9;
  sVar9 = auVar8._6_2_;
  auVar17._6_2_ = (sVar9 < (short)uVar26) * uVar26 | (ushort)(sVar9 >= (short)uVar26) * sVar9;
  sVar9 = auVar8._8_2_;
  auVar17._8_2_ = (sVar9 < (short)uVar27) * uVar27 | (ushort)(sVar9 >= (short)uVar27) * sVar9;
  sVar9 = auVar8._10_2_;
  auVar17._10_2_ = (sVar9 < (short)uVar28) * uVar28 | (ushort)(sVar9 >= (short)uVar28) * sVar9;
  sVar9 = auVar8._12_2_;
  sVar18 = auVar8._14_2_;
  auVar17._12_2_ = (sVar9 < (short)uVar29) * uVar29 | (ushort)(sVar9 >= (short)uVar29) * sVar9;
  auVar17._14_2_ = (sVar18 < (short)uVar30) * uVar30 | (ushort)(sVar18 >= (short)uVar30) * sVar18;
  auVar7 = psubusw(auVar17,auVar7);
  local_88 = -(ushort)(auVar7._0_2_ == 0);
  sStack_86 = -(ushort)(auVar7._2_2_ == 0);
  sStack_84 = -(ushort)(auVar7._4_2_ == 0);
  sStack_82 = -(ushort)(auVar7._6_2_ == 0);
  sStack_80 = -(ushort)(auVar7._8_2_ == 0);
  sStack_7e = -(ushort)(auVar7._10_2_ == 0);
  sStack_7c = -(ushort)(auVar7._12_2_ == 0);
  sStack_7a = -(ushort)(auVar7._14_2_ == 0);
  d5[0] = auVar39._0_8_;
  d5[1] = auVar13._0_8_;
  d4[0] = auVar40._8_8_;
  d4[1] = auVar32._8_8_;
  highbd_filter4_dual_sse2(&d4,&d5,ps,qs,(__m128i *)&local_88,&thresh0_1,bd,&local_e8);
  highbd_transpose4x8_8x4_sse2(ps + 1,ps,qs,qs + 1,&d0,&d1,&d2,&d3,&d4,&d5,&d6,&d7);
  *(longlong *)(s + -2) = d0[0];
  *(longlong *)(s + (long)p + -2) = d1[0];
  *(longlong *)(s + (long)(p * 2) + -2) = d2[0];
  *(longlong *)(s + (long)(p * 3) + -2) = d3[0];
  *(longlong *)(s + (long)(p * 4) + -2) = d4[0];
  *(longlong *)(s + (long)(p * 5) + -2) = d5[0];
  *(longlong *)(s + (long)(p * 6) + -2) = d6[0];
  *(longlong *)(s + (long)(p * 7) + -2) = d7[0];
  return;
}

Assistant:

void aom_highbd_lpf_vertical_4_dual_sse2(
    uint16_t *s, int p, const uint8_t *blimit0, const uint8_t *limit0,
    const uint8_t *thresh0, const uint8_t *blimit1, const uint8_t *limit1,
    const uint8_t *thresh1, int bd) {
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i ps[2], qs[2];

  x0 = _mm_loadl_epi64((__m128i *)(s - 2 + 0 * p));
  x1 = _mm_loadl_epi64((__m128i *)(s - 2 + 1 * p));
  x2 = _mm_loadl_epi64((__m128i *)(s - 2 + 2 * p));
  x3 = _mm_loadl_epi64((__m128i *)(s - 2 + 3 * p));
  x4 = _mm_loadl_epi64((__m128i *)(s - 2 + 4 * p));
  x5 = _mm_loadl_epi64((__m128i *)(s - 2 + 5 * p));
  x6 = _mm_loadl_epi64((__m128i *)(s - 2 + 6 * p));
  x7 = _mm_loadl_epi64((__m128i *)(s - 2 + 7 * p));

  highbd_transpose8x8_low_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &d0, &d1,
                               &d2, &d3);

  highbd_lpf_internal_4_dual_sse2(&d0, &d1, &d2, &d3, ps, qs, blimit0, limit0,
                                  thresh0, blimit1, limit1, thresh1, bd);

  highbd_transpose4x8_8x4_sse2(&ps[1], &ps[0], &qs[0], &qs[1], &d0, &d1, &d2,
                               &d3, &d4, &d5, &d6, &d7);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
  _mm_storel_epi64((__m128i *)(s - 2 + 4 * p), d4);
  _mm_storel_epi64((__m128i *)(s - 2 + 5 * p), d5);
  _mm_storel_epi64((__m128i *)(s - 2 + 6 * p), d6);
  _mm_storel_epi64((__m128i *)(s - 2 + 7 * p), d7);
}